

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringOps.cpp
# Opt level: O0

string * gmlc::utilities::stringOps::xmlCharacterCodeReplace(string *str)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  string *in_RDI;
  size_type codeLoc;
  string *out;
  size_type in_stack_ffffffffffffffd0;
  char *in_stack_ffffffffffffffd8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffe0;
  uint7 in_stack_ffffffffffffffe8;
  undefined1 uVar2;
  
  uVar2 = 0;
  std::__cxx11::string::string
            (in_RSI,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    (ulong)in_stack_ffffffffffffffe8);
  for (pbVar1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                find(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
      pbVar1 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                0xffffffffffffffff;
      pbVar1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                         (pbVar1,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0)) {
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::replace
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RSI,
               CONCAT17(uVar2,in_stack_ffffffffffffffe8),(size_type)pbVar1,in_stack_ffffffffffffffd8
              );
  }
  for (pbVar1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                find((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     0xffffffffffffffff,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
      pbVar1 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                0xffffffffffffffff;
      pbVar1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                         (pbVar1,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0)) {
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::replace
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RSI,
               CONCAT17(uVar2,in_stack_ffffffffffffffe8),(size_type)pbVar1,in_stack_ffffffffffffffd8
              );
  }
  for (pbVar1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                find((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     0xffffffffffffffff,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
      pbVar1 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                0xffffffffffffffff;
      pbVar1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                         (pbVar1,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0)) {
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::replace
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RSI,
               CONCAT17(uVar2,in_stack_ffffffffffffffe8),(size_type)pbVar1,in_stack_ffffffffffffffd8
              );
  }
  for (pbVar1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                find((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     0xffffffffffffffff,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
      pbVar1 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                0xffffffffffffffff;
      pbVar1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                         (pbVar1,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0)) {
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::replace
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RSI,
               CONCAT17(uVar2,in_stack_ffffffffffffffe8),(size_type)pbVar1,in_stack_ffffffffffffffd8
              );
  }
  for (pbVar1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                find((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     0xffffffffffffffff,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
      pbVar1 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                0xffffffffffffffff;
      pbVar1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                         (pbVar1,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0)) {
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::replace
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RSI,
               CONCAT17(uVar2,in_stack_ffffffffffffffe8),(size_type)pbVar1,in_stack_ffffffffffffffd8
              );
  }
  return in_RDI;
}

Assistant:

std::string xmlCharacterCodeReplace(std::string str)
    {
        std::string out = std::move(str);
        auto codeLoc = out.find("&gt;");
        while (codeLoc != std::string::npos) {
            out.replace(codeLoc, 4, ">");
            codeLoc = out.find("&gt;", codeLoc + 1);
        }
        codeLoc = out.find("&lt;");
        while (codeLoc != std::string::npos) {
            out.replace(codeLoc, 4, "<");
            codeLoc = out.find("&lt;", codeLoc + 1);
        }
        codeLoc = out.find("&quot;");
        while (codeLoc != std::string::npos) {
            out.replace(codeLoc, 6, "\"");
            codeLoc = out.find("&quot;", codeLoc + 1);
        }
        codeLoc = out.find("&apos;");
        while (codeLoc != std::string::npos) {
            out.replace(codeLoc, 6, "'");
            codeLoc = out.find("&apos;", codeLoc + 1);
        }
        // &amp; is last so it can't trigger other sequences
        codeLoc = out.find("&amp;");
        while (codeLoc != std::string::npos) {
            out.replace(codeLoc, 5, "&");
            codeLoc = out.find("&amp;", codeLoc + 1);
        }
        return out;
    }